

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memdbFileSize(sqlite3_file *pFile,sqlite_int64 *pSize)

{
  sqlite3_io_methods *psVar1;
  sqlite3_mutex *psVar2;
  
  psVar1 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar1->xTruncate == (sqlite3_mutex *)0x0) {
    *pSize = *(sqlite_int64 *)psVar1;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar1->xTruncate);
    psVar2 = (sqlite3_mutex *)psVar1->xTruncate;
    *pSize = *(sqlite_int64 *)psVar1;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar2);
    }
  }
  return 0;
}

Assistant:

static int memdbFileSize(sqlite3_file *pFile, sqlite_int64 *pSize){
  MemStore *p = ((MemFile*)pFile)->pStore;
  memdbEnter(p);
  *pSize = p->sz;
  memdbLeave(p);
  return SQLITE_OK;
}